

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O3

void Rasterizer::doRender<RasterizerA2>(RasterizerA2 *self,uint32_t argb32)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  int32_t *piVar3;
  uint uVar4;
  Image *pIVar5;
  long lVar6;
  Bounds *pBVar7;
  size_t sVar8;
  Cell *pCVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ulong uVar27;
  int iVar28;
  uint8_t *puVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  short sVar37;
  short sVar38;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  undefined1 auVar39 [16];
  short sVar47;
  short sVar48;
  undefined1 in_XMM1 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM7 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  short sVar59;
  short sVar70;
  ushort uVar71;
  ushort uVar73;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  short sVar77;
  short sVar83;
  short sVar84;
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar88;
  int iVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar90 [16];
  int iVar91;
  int iVar95;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  short sVar50;
  short sVar54;
  undefined1 auVar60 [12];
  undefined1 auVar65 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  short sVar72;
  undefined1 auVar78 [12];
  undefined1 auVar80 [16];
  
  auVar26 = _DAT_00114190;
  auVar25 = _DAT_00114160;
  uVar32 = (self->super_CellRasterizer).super_Rasterizer._options;
  bVar23 = (byte)(argb32 >> 8);
  if ((self->super_CellRasterizer).super_Rasterizer._fillMode != 1) {
    if ((uVar32 & 1) != 0) {
      uVar32 = (self->_yBounds).start;
      uVar27 = (ulong)(int)uVar32;
      uVar4 = (self->_yBounds).end;
      if (uVar32 <= uVar4) {
        pIVar5 = (self->super_CellRasterizer).super_Rasterizer._dst;
        lVar6 = pIVar5->_stride;
        iVar31 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
        iVar28 = (bVar23 | 0xff0000) * (argb32 >> 0x18);
        uVar32 = iVar31 + (iVar31 + 0x800080U >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff |
                 (iVar28 + 0x800080U >> 8 & 0xff00ff) + iVar28 + 0x800080 & 0xff00ff00;
        auVar39._4_4_ = uVar32;
        auVar39._0_4_ = uVar32;
        auVar39._8_4_ = uVar32;
        auVar39._12_4_ = uVar32;
        auVar39 = pmovzxbw(auVar39,auVar39);
        puVar29 = pIVar5->_data + lVar6 * uVar27;
        lVar30 = uVar27 * 8;
        auVar49 = pmovsxwd(in_XMM1,0x1ff01ff01ff01ff);
        auVar51 = pmovzxbw(in_XMM3,0x8080808080808080);
        auVar55 = pmovzxbw(in_XMM7,0xffffffffffffffff);
        auVar56 = pmovzxbw(in_XMM8,0x8080808080808080);
        do {
          pBVar7 = self->_xBounds;
          if (pBVar7[uVar27].end != 0) {
            sVar8 = self->_cellStride;
            pCVar9 = self->_cells;
            iVar31 = pBVar7[uVar27].end + 1;
            iVar28 = (self->super_CellRasterizer).super_Rasterizer._width;
            if (iVar28 < iVar31) {
              iVar31 = iVar28;
            }
            uVar33 = (ulong)pBVar7[uVar27].start;
            pBVar7[uVar27].start = 0x7fffffff;
            pBVar7[uVar27].end = 0;
            uVar34 = (ulong)iVar31;
            iVar28 = 0;
            sVar38 = auVar39._0_2_;
            sVar40 = auVar39._2_2_;
            sVar41 = auVar39._4_2_;
            sVar42 = auVar39._6_2_;
            sVar43 = auVar39._8_2_;
            sVar44 = auVar39._10_2_;
            sVar46 = auVar39._12_2_;
            sVar48 = auVar39._14_2_;
            if (3 < uVar34 - uVar33) {
              uVar35 = uVar34 - uVar33 >> 2;
              lVar36 = sVar8 * lVar30;
              do {
                piVar1 = (int32_t *)((long)&pCVar9[uVar33].cover + lVar36);
                iVar31 = *piVar1;
                piVar3 = (int32_t *)((long)&pCVar9[uVar33 + 2].cover + lVar36);
                iVar95 = iVar31 + piVar1[2];
                auVar62._4_4_ = iVar95;
                auVar62._0_4_ = iVar31;
                auVar62._8_8_ = 0;
                iVar91 = iVar31 + iVar28;
                iVar88 = iVar95 + iVar28;
                iVar89 = piVar1[2] + *piVar3 + iVar28;
                iVar28 = *piVar3 + piVar3[2] + iVar28 + iVar95;
                auVar93._0_4_ = iVar91 - ((uint)piVar1[1] >> 9);
                auVar93._4_4_ = iVar88 - ((uint)piVar1[3] >> 9);
                auVar93._8_4_ = (iVar89 + iVar31) - ((uint)piVar3[1] >> 9);
                auVar93._12_4_ = iVar28 - ((uint)piVar3[3] >> 9);
                auVar74 = packusdw(auVar93 & auVar49,auVar93 & auVar49);
                iVar31 = 0x1ff01ff - auVar74._0_4_;
                iVar91 = 0x1ff01ff - auVar74._4_4_;
                iVar95 = 0x1ff01ff - auVar74._8_4_;
                iVar88 = 0x1ff01ff - auVar74._12_4_;
                sVar37 = auVar74._0_2_;
                sVar77 = (short)iVar31;
                sVar50 = auVar74._2_2_;
                sVar83 = (short)((uint)iVar31 >> 0x10);
                sVar54 = auVar74._4_2_;
                sVar84 = (short)iVar91;
                uVar71 = (ushort)(sVar54 < sVar84) * sVar54 | (ushort)(sVar54 >= sVar84) * sVar84;
                sVar54 = auVar74._6_2_;
                sVar84 = (short)((uint)iVar91 >> 0x10);
                uVar73 = (ushort)(sVar54 < sVar84) * sVar54 | (ushort)(sVar54 >= sVar84) * sVar84;
                auVar79._0_8_ =
                     CONCAT26(uVar73,CONCAT24(uVar71,CONCAT22((ushort)(sVar50 < sVar83) * sVar50 |
                                                              (ushort)(sVar50 >= sVar83) * sVar83,
                                                              (ushort)(sVar37 < sVar77) * sVar37 |
                                                              (ushort)(sVar37 >= sVar77) * sVar77)))
                ;
                sVar37 = auVar74._8_2_;
                sVar50 = (short)iVar95;
                auVar78._0_10_ =
                     CONCAT28((ushort)(sVar37 < sVar50) * sVar37 |
                              (ushort)(sVar37 >= sVar50) * sVar50,auVar79._0_8_);
                sVar37 = auVar74._10_2_;
                sVar50 = (short)((uint)iVar95 >> 0x10);
                auVar78._10_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar74._12_2_;
                sVar50 = (short)iVar88;
                sVar54 = (short)((uint)iVar88 >> 0x10);
                auVar86._12_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                auVar86._0_12_ = auVar78;
                sVar37 = auVar74._14_2_;
                auVar86._14_2_ =
                     (ushort)(sVar37 < sVar54) * sVar37 | (ushort)(sVar37 >= sVar54) * sVar54;
                auVar86 = pshuflw(auVar62 << 0x40,auVar86,0x50);
                auVar94._12_2_ = uVar73;
                auVar94._0_12_ = auVar78;
                auVar94._14_2_ = uVar73;
                auVar80._12_4_ = auVar94._12_4_;
                auVar80._10_2_ = uVar71;
                auVar80._0_10_ = auVar78._0_10_;
                auVar79._10_6_ = auVar80._10_6_;
                auVar79._8_2_ = uVar71;
                *(undefined1 (*) [16])((long)&pCVar9[uVar33].cover + lVar36) = (undefined1  [16])0x0
                ;
                *(undefined1 (*) [16])((long)&pCVar9[uVar33 + 2].cover + lVar36) =
                     (undefined1  [16])0x0;
                auVar62 = *(undefined1 (*) [16])(puVar29 + uVar33 * 4);
                auVar94 = pmovzxbw(auVar74,auVar62);
                in_XMM13._0_2_ = CONCAT11(0,auVar62[8]);
                in_XMM13[2] = auVar62[9];
                in_XMM13[3] = 0;
                in_XMM13[4] = auVar62[10];
                in_XMM13[5] = 0;
                in_XMM13[6] = auVar62[0xb];
                in_XMM13[7] = 0;
                in_XMM13[8] = auVar62[0xc];
                in_XMM13[9] = 0;
                in_XMM13[10] = auVar62[0xd];
                in_XMM13[0xb] = 0;
                in_XMM13[0xc] = auVar62[0xe];
                in_XMM13[0xd] = 0;
                in_XMM13[0xe] = auVar62[0xf];
                in_XMM13[0xf] = 0;
                auVar87._0_4_ = auVar86._0_4_;
                auVar87._4_4_ = auVar87._0_4_;
                auVar87._8_4_ = auVar86._4_4_;
                auVar87._12_4_ = auVar86._4_4_;
                auVar74._4_4_ = auVar79._8_4_;
                auVar74._0_4_ = auVar79._8_4_;
                auVar74._8_4_ = auVar80._12_4_;
                auVar74._12_4_ = auVar80._12_4_;
                auVar87 = auVar87 ^ auVar55;
                auVar74 = auVar74 ^ auVar55;
                auVar96._0_2_ =
                     auVar86._0_2_ * sVar38 + auVar56._0_2_ + auVar87._0_2_ * auVar94._0_2_;
                auVar96._2_2_ =
                     auVar86._2_2_ * sVar40 + auVar56._2_2_ + auVar87._2_2_ * auVar94._2_2_;
                auVar96._4_2_ =
                     auVar86._0_2_ * sVar41 + auVar56._4_2_ + auVar87._4_2_ * auVar94._4_2_;
                auVar96._6_2_ =
                     auVar86._2_2_ * sVar42 + auVar56._6_2_ + auVar87._6_2_ * auVar94._6_2_;
                auVar96._8_2_ =
                     auVar86._4_2_ * sVar43 + auVar56._8_2_ + auVar87._8_2_ * auVar94._8_2_;
                auVar96._10_2_ =
                     auVar86._6_2_ * sVar44 + auVar56._10_2_ + auVar87._10_2_ * auVar94._10_2_;
                auVar96._12_2_ =
                     auVar86._4_2_ * sVar46 + auVar56._12_2_ + auVar87._12_2_ * auVar94._12_2_;
                auVar96._14_2_ =
                     auVar86._6_2_ * sVar48 + auVar56._14_2_ + auVar87._14_2_ * auVar94._14_2_;
                auVar86 = pmulhuw(auVar96,auVar25);
                auVar81._0_2_ = uVar71 * sVar38 + auVar56._0_2_ + auVar74._0_2_ * in_XMM13._0_2_;
                auVar81._2_2_ = uVar71 * sVar40 + auVar56._2_2_ + auVar74._2_2_ * (ushort)auVar62[9]
                ;
                auVar81._4_2_ =
                     uVar71 * sVar41 + auVar56._4_2_ + auVar74._4_2_ * (ushort)auVar62[10];
                auVar81._6_2_ =
                     uVar71 * sVar42 + auVar56._6_2_ + auVar74._6_2_ * (ushort)auVar62[0xb];
                auVar81._8_2_ =
                     uVar73 * sVar43 + auVar56._8_2_ + auVar74._8_2_ * (ushort)auVar62[0xc];
                auVar81._10_2_ =
                     uVar73 * sVar44 + auVar56._10_2_ + auVar74._10_2_ * (ushort)auVar62[0xd];
                auVar81._12_2_ =
                     uVar73 * sVar46 + auVar56._12_2_ + auVar74._12_2_ * (ushort)auVar62[0xe];
                auVar81._14_2_ =
                     uVar73 * sVar48 + auVar56._14_2_ + auVar74._14_2_ * (ushort)auVar62[0xf];
                auVar62 = pmulhuw(auVar81,auVar25);
                sVar37 = auVar86._0_2_;
                sVar50 = auVar86._2_2_;
                sVar54 = auVar86._4_2_;
                sVar77 = auVar86._6_2_;
                sVar83 = auVar86._8_2_;
                sVar84 = auVar86._10_2_;
                sVar45 = auVar86._12_2_;
                sVar47 = auVar86._14_2_;
                sVar59 = auVar62._0_2_;
                sVar70 = auVar62._2_2_;
                sVar72 = auVar62._4_2_;
                sVar10 = auVar62._6_2_;
                sVar11 = auVar62._8_2_;
                sVar12 = auVar62._10_2_;
                sVar13 = auVar62._12_2_;
                sVar14 = auVar62._14_2_;
                puVar2 = puVar29 + uVar33 * 4;
                *puVar2 = (0 < sVar37) * (sVar37 < 0x100) * auVar86[0] - (0xff < sVar37);
                puVar2[1] = (0 < sVar50) * (sVar50 < 0x100) * auVar86[2] - (0xff < sVar50);
                puVar2[2] = (0 < sVar54) * (sVar54 < 0x100) * auVar86[4] - (0xff < sVar54);
                puVar2[3] = (0 < sVar77) * (sVar77 < 0x100) * auVar86[6] - (0xff < sVar77);
                puVar2[4] = (0 < sVar83) * (sVar83 < 0x100) * auVar86[8] - (0xff < sVar83);
                puVar2[5] = (0 < sVar84) * (sVar84 < 0x100) * auVar86[10] - (0xff < sVar84);
                puVar2[6] = (0 < sVar45) * (sVar45 < 0x100) * auVar86[0xc] - (0xff < sVar45);
                puVar2[7] = (0 < sVar47) * (sVar47 < 0x100) * auVar86[0xe] - (0xff < sVar47);
                puVar2[8] = (0 < sVar59) * (sVar59 < 0x100) * auVar62[0] - (0xff < sVar59);
                puVar2[9] = (0 < sVar70) * (sVar70 < 0x100) * auVar62[2] - (0xff < sVar70);
                puVar2[10] = (0 < sVar72) * (sVar72 < 0x100) * auVar62[4] - (0xff < sVar72);
                puVar2[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar62[6] - (0xff < sVar10);
                puVar2[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar62[8] - (0xff < sVar11);
                puVar2[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar62[10] - (0xff < sVar12);
                puVar2[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar62[0xc] - (0xff < sVar13);
                puVar2[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar62[0xe] - (0xff < sVar14);
                uVar33 = uVar33 + 4;
                uVar35 = uVar35 - 1;
              } while (uVar35 != 0);
            }
            in_XMM13 = pmovzxbw(in_XMM13,0xffffffffffffffff);
            if (uVar33 < uVar34) {
              lVar36 = sVar8 * lVar30;
              iVar31 = iVar28;
              do {
                iVar31 = iVar31 + *(int32_t *)((long)&pCVar9[uVar33].cover + lVar36);
                *(undefined8 *)((long)&pCVar9[uVar33].cover + lVar36) = 0;
                auVar82._0_4_ =
                     iVar31 - ((uint)*(int32_t *)((long)&pCVar9[uVar33].area + lVar36) >> 9);
                auVar82._4_4_ = iVar28;
                auVar82._8_4_ = iVar28;
                auVar82._12_4_ = iVar28;
                auVar62 = packusdw(auVar82 & auVar49,auVar82 & auVar49);
                iVar91 = auVar49._0_4_ - auVar62._0_4_;
                iVar95 = auVar49._4_4_ - auVar62._4_4_;
                iVar88 = auVar49._8_4_ - auVar62._8_4_;
                iVar89 = auVar49._12_4_ - auVar62._12_4_;
                sVar37 = auVar62._0_2_;
                sVar50 = (short)iVar91;
                auVar52._0_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._2_2_;
                sVar50 = (short)((uint)iVar91 >> 0x10);
                auVar52._2_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._4_2_;
                sVar50 = (short)iVar95;
                auVar52._4_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._6_2_;
                sVar50 = (short)((uint)iVar95 >> 0x10);
                auVar52._6_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._8_2_;
                sVar50 = (short)iVar88;
                auVar52._8_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._10_2_;
                sVar50 = (short)((uint)iVar88 >> 0x10);
                auVar52._10_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._12_2_;
                sVar50 = (short)iVar89;
                sVar54 = (short)((uint)iVar89 >> 0x10);
                auVar52._12_2_ =
                     (ushort)(sVar37 < sVar50) * sVar37 | (ushort)(sVar37 >= sVar50) * sVar50;
                sVar37 = auVar62._14_2_;
                auVar52._14_2_ =
                     (ushort)(sVar37 < sVar54) * sVar37 | (ushort)(sVar37 >= sVar54) * sVar54;
                auVar62 = pshuflw(auVar52,auVar52,0);
                auVar86 = pmovzxbw(ZEXT416(*(uint *)(puVar29 + uVar33 * 4)),
                                   ZEXT416(*(uint *)(puVar29 + uVar33 * 4)));
                auVar74 = auVar62 ^ in_XMM13;
                auVar53._0_2_ =
                     auVar74._0_2_ * auVar86._0_2_ + auVar62._0_2_ * sVar38 + auVar51._0_2_;
                auVar53._2_2_ =
                     auVar74._2_2_ * auVar86._2_2_ + auVar62._2_2_ * sVar40 + auVar51._2_2_;
                auVar53._4_2_ =
                     auVar74._4_2_ * auVar86._4_2_ + auVar62._4_2_ * sVar41 + auVar51._4_2_;
                auVar53._6_2_ =
                     auVar74._6_2_ * auVar86._6_2_ + auVar62._6_2_ * sVar42 + auVar51._6_2_;
                auVar53._8_2_ =
                     auVar74._8_2_ * auVar86._8_2_ + auVar62._8_2_ * sVar43 + auVar51._8_2_;
                auVar53._10_2_ =
                     auVar74._10_2_ * auVar86._10_2_ + auVar62._10_2_ * sVar44 + auVar51._10_2_;
                auVar53._12_2_ =
                     auVar74._12_2_ * auVar86._12_2_ + auVar62._12_2_ * sVar46 + auVar51._12_2_;
                auVar53._14_2_ =
                     auVar74._14_2_ * auVar86._14_2_ + auVar62._14_2_ * sVar48 + auVar51._14_2_;
                auVar62 = pmulhuw(auVar53,auVar26);
                sVar37 = auVar62._0_2_;
                sVar50 = auVar62._2_2_;
                sVar54 = auVar62._4_2_;
                sVar77 = auVar62._6_2_;
                *(uint *)(puVar29 + uVar33 * 4) =
                     CONCAT13((0 < sVar77) * (sVar77 < 0x100) * auVar62[6] - (0xff < sVar77),
                              CONCAT12((0 < sVar54) * (sVar54 < 0x100) * auVar62[4] -
                                       (0xff < sVar54),
                                       CONCAT11((0 < sVar50) * (sVar50 < 0x100) * auVar62[2] -
                                                (0xff < sVar50),
                                                (0 < sVar37) * (sVar37 < 0x100) * auVar62[0] -
                                                (0xff < sVar37))));
                uVar33 = uVar33 + 1;
              } while (uVar34 != uVar33);
            }
          }
          uVar27 = uVar27 + 1;
          puVar29 = puVar29 + lVar6;
          lVar30 = lVar30 + 8;
        } while (uVar27 <= (ulong)(long)(int)uVar4);
      }
      (self->_yBounds).start = 0x7fffffff;
      (self->_yBounds).end = 0;
      return;
    }
    RasterizerA2::_renderImpl<CompositorScalar,false>(self,argb32);
    return;
  }
  if ((uVar32 & 1) != 0) {
    uVar32 = (self->_yBounds).start;
    uVar27 = (ulong)(int)uVar32;
    uVar4 = (self->_yBounds).end;
    if (uVar32 <= uVar4) {
      pIVar5 = (self->super_CellRasterizer).super_Rasterizer._dst;
      lVar6 = pIVar5->_stride;
      iVar31 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
      iVar28 = (bVar23 | 0xff0000) * (argb32 >> 0x18);
      uVar32 = iVar31 + (iVar31 + 0x800080U >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff |
               (iVar28 + 0x800080U >> 8 & 0xff00ff) + iVar28 + 0x800080 & 0xff00ff00;
      auVar49._4_4_ = uVar32;
      auVar49._0_4_ = uVar32;
      auVar49._8_4_ = uVar32;
      auVar49._12_4_ = uVar32;
      auVar39 = pmovzxbw(auVar49,auVar49);
      puVar29 = pIVar5->_data + lVar6 * uVar27;
      lVar30 = uVar27 * 8;
      auVar49 = pmovzxbw(in_XMM1,0xffffffffffffffff);
      auVar51 = pmovzxbw(in_XMM2,0xffffffffffffffff);
      auVar55 = pmovzxbw(in_XMM3,0x8080808080808080);
      auVar56 = pmovzxbw(in_XMM6,0x8080808080808080);
      do {
        pBVar7 = self->_xBounds;
        if (pBVar7[uVar27].end != 0) {
          sVar8 = self->_cellStride;
          pCVar9 = self->_cells;
          iVar31 = pBVar7[uVar27].end + 1;
          iVar28 = (self->super_CellRasterizer).super_Rasterizer._width;
          if (iVar28 < iVar31) {
            iVar31 = iVar28;
          }
          uVar33 = (ulong)pBVar7[uVar27].start;
          pBVar7[uVar27].start = 0x7fffffff;
          pBVar7[uVar27].end = 0;
          uVar34 = (ulong)iVar31;
          auVar57 = (undefined1  [16])0x0;
          sVar37 = auVar39._0_2_;
          sVar50 = auVar39._2_2_;
          sVar54 = auVar39._4_2_;
          sVar77 = auVar39._6_2_;
          sVar83 = auVar39._8_2_;
          sVar84 = auVar39._10_2_;
          sVar45 = auVar39._12_2_;
          sVar47 = auVar39._14_2_;
          sVar38 = auVar49._0_2_;
          sVar40 = auVar49._2_2_;
          sVar41 = auVar49._4_2_;
          sVar42 = auVar49._6_2_;
          sVar43 = auVar49._8_2_;
          sVar44 = auVar49._10_2_;
          sVar46 = auVar49._12_2_;
          sVar48 = auVar49._14_2_;
          if (3 < uVar34 - uVar33) {
            uVar35 = uVar34 - uVar33 >> 2;
            lVar36 = sVar8 * lVar30;
            do {
              piVar1 = (int32_t *)((long)&pCVar9[uVar33].cover + lVar36);
              iVar28 = *piVar1;
              piVar3 = (int32_t *)((long)&pCVar9[uVar33 + 2].cover + lVar36);
              iVar88 = iVar28 + piVar1[2];
              auVar24._4_4_ = iVar88;
              auVar24._0_4_ = iVar28;
              auVar61._0_4_ = piVar1[1] >> 9;
              auVar61._4_4_ = piVar1[3] >> 9;
              auVar61._8_4_ = piVar3[1] >> 9;
              auVar61._12_4_ = piVar3[3] >> 9;
              auVar24._8_8_ = 0;
              iVar31 = auVar57._0_4_;
              iVar91 = auVar57._4_4_;
              iVar95 = auVar57._8_4_;
              iVar89 = *piVar3 + piVar3[2] + auVar57._12_4_ + iVar88;
              auVar57._4_4_ = iVar89;
              auVar57._0_4_ = iVar89;
              auVar57._8_4_ = iVar89;
              auVar57._12_4_ = iVar89;
              auVar85._0_4_ = (iVar28 + iVar31) - auVar61._0_4_;
              auVar85._4_4_ = (iVar88 + iVar91) - auVar61._4_4_;
              auVar85._8_4_ = (piVar1[2] + *piVar3 + iVar95 + iVar28) - auVar61._8_4_;
              auVar85._12_4_ = iVar89 - auVar61._12_4_;
              auVar62 = pabsd(auVar61,auVar85);
              auVar62 = packssdw(auVar62,auVar62);
              sVar59 = auVar62._0_2_;
              sVar70 = auVar62._2_2_;
              sVar72 = auVar62._4_2_;
              uVar71 = (ushort)(sVar41 < sVar72) * sVar41 | (ushort)(sVar41 >= sVar72) * sVar72;
              sVar72 = auVar62._6_2_;
              uVar73 = (ushort)(sVar42 < sVar72) * sVar42 | (ushort)(sVar42 >= sVar72) * sVar72;
              auVar64._0_8_ =
                   CONCAT26(uVar73,CONCAT24(uVar71,CONCAT22((ushort)(sVar40 < sVar70) * sVar40 |
                                                            (ushort)(sVar40 >= sVar70) * sVar70,
                                                            (ushort)(sVar38 < sVar59) * sVar38 |
                                                            (ushort)(sVar38 >= sVar59) * sVar59)));
              sVar59 = auVar62._8_2_;
              auVar60._0_10_ =
                   CONCAT28((ushort)(sVar43 < sVar59) * sVar43 | (ushort)(sVar43 >= sVar59) * sVar59
                            ,auVar64._0_8_);
              sVar59 = auVar62._10_2_;
              auVar60._10_2_ =
                   (ushort)(sVar44 < sVar59) * sVar44 | (ushort)(sVar44 >= sVar59) * sVar59;
              sVar59 = auVar62._12_2_;
              sVar70 = auVar62._14_2_;
              auVar63._12_2_ =
                   (ushort)(sVar46 < sVar59) * sVar46 | (ushort)(sVar46 >= sVar59) * sVar59;
              auVar63._0_12_ = auVar60;
              auVar63._14_2_ =
                   (ushort)(sVar48 < sVar70) * sVar48 | (ushort)(sVar48 >= sVar70) * sVar70;
              auVar74 = pshuflw(auVar24 << 0x40,auVar63,0x50);
              auVar66._12_2_ = uVar73;
              auVar66._0_12_ = auVar60;
              auVar66._14_2_ = uVar73;
              auVar65._12_4_ = auVar66._12_4_;
              auVar65._10_2_ = uVar71;
              auVar65._0_10_ = auVar60._0_10_;
              auVar64._10_6_ = auVar65._10_6_;
              auVar64._8_2_ = uVar71;
              *(undefined1 (*) [16])((long)&pCVar9[uVar33].cover + lVar36) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])((long)&pCVar9[uVar33 + 2].cover + lVar36) =
                   (undefined1  [16])0x0;
              auVar62 = *(undefined1 (*) [16])(puVar29 + uVar33 * 4);
              auVar86 = pmovzxbw(auVar85,auVar62);
              auVar75._0_4_ = auVar74._0_4_;
              auVar75._4_4_ = auVar75._0_4_;
              auVar75._8_4_ = auVar74._4_4_;
              auVar75._12_4_ = auVar74._4_4_;
              auVar67._4_4_ = auVar64._8_4_;
              auVar67._0_4_ = auVar64._8_4_;
              auVar67._8_4_ = auVar65._12_4_;
              auVar67._12_4_ = auVar65._12_4_;
              auVar75 = auVar75 ^ auVar49;
              auVar67 = auVar67 ^ auVar49;
              auVar90._0_2_ = auVar74._0_2_ * sVar37 + auVar56._0_2_ + auVar75._0_2_ * auVar86._0_2_
              ;
              auVar90._2_2_ = auVar74._2_2_ * sVar50 + auVar56._2_2_ + auVar75._2_2_ * auVar86._2_2_
              ;
              auVar90._4_2_ = auVar74._0_2_ * sVar54 + auVar56._4_2_ + auVar75._4_2_ * auVar86._4_2_
              ;
              auVar90._6_2_ = auVar74._2_2_ * sVar77 + auVar56._6_2_ + auVar75._6_2_ * auVar86._6_2_
              ;
              auVar90._8_2_ = auVar74._4_2_ * sVar83 + auVar56._8_2_ + auVar75._8_2_ * auVar86._8_2_
              ;
              auVar90._10_2_ =
                   auVar74._6_2_ * sVar84 + auVar56._10_2_ + auVar75._10_2_ * auVar86._10_2_;
              auVar90._12_2_ =
                   auVar74._4_2_ * sVar45 + auVar56._12_2_ + auVar75._12_2_ * auVar86._12_2_;
              auVar90._14_2_ =
                   auVar74._6_2_ * sVar47 + auVar56._14_2_ + auVar75._14_2_ * auVar86._14_2_;
              auVar74 = pmulhuw(auVar90,auVar25);
              auVar92._0_2_ = uVar71 * sVar37 + auVar56._0_2_ + auVar67._0_2_ * (ushort)auVar62[8];
              auVar92._2_2_ = uVar71 * sVar50 + auVar56._2_2_ + auVar67._2_2_ * (ushort)auVar62[9];
              auVar92._4_2_ = uVar71 * sVar54 + auVar56._4_2_ + auVar67._4_2_ * (ushort)auVar62[10];
              auVar92._6_2_ = uVar71 * sVar77 + auVar56._6_2_ + auVar67._6_2_ * (ushort)auVar62[0xb]
              ;
              auVar92._8_2_ = uVar73 * sVar83 + auVar56._8_2_ + auVar67._8_2_ * (ushort)auVar62[0xc]
              ;
              auVar92._10_2_ =
                   uVar73 * sVar84 + auVar56._10_2_ + auVar67._10_2_ * (ushort)auVar62[0xd];
              auVar92._12_2_ =
                   uVar73 * sVar45 + auVar56._12_2_ + auVar67._12_2_ * (ushort)auVar62[0xe];
              auVar92._14_2_ =
                   uVar73 * sVar47 + auVar56._14_2_ + auVar67._14_2_ * (ushort)auVar62[0xf];
              auVar62 = pmulhuw(auVar92,auVar25);
              sVar59 = auVar74._0_2_;
              sVar70 = auVar74._2_2_;
              sVar72 = auVar74._4_2_;
              sVar10 = auVar74._6_2_;
              sVar11 = auVar74._8_2_;
              sVar12 = auVar74._10_2_;
              sVar13 = auVar74._12_2_;
              sVar14 = auVar74._14_2_;
              sVar15 = auVar62._0_2_;
              sVar16 = auVar62._2_2_;
              sVar17 = auVar62._4_2_;
              sVar18 = auVar62._6_2_;
              sVar19 = auVar62._8_2_;
              sVar20 = auVar62._10_2_;
              sVar21 = auVar62._12_2_;
              sVar22 = auVar62._14_2_;
              puVar2 = puVar29 + uVar33 * 4;
              *puVar2 = (0 < sVar59) * (sVar59 < 0x100) * auVar74[0] - (0xff < sVar59);
              puVar2[1] = (0 < sVar70) * (sVar70 < 0x100) * auVar74[2] - (0xff < sVar70);
              puVar2[2] = (0 < sVar72) * (sVar72 < 0x100) * auVar74[4] - (0xff < sVar72);
              puVar2[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar74[6] - (0xff < sVar10);
              puVar2[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar74[8] - (0xff < sVar11);
              puVar2[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar74[10] - (0xff < sVar12);
              puVar2[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar74[0xc] - (0xff < sVar13);
              puVar2[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar74[0xe] - (0xff < sVar14);
              puVar2[8] = (0 < sVar15) * (sVar15 < 0x100) * auVar62[0] - (0xff < sVar15);
              puVar2[9] = (0 < sVar16) * (sVar16 < 0x100) * auVar62[2] - (0xff < sVar16);
              puVar2[10] = (0 < sVar17) * (sVar17 < 0x100) * auVar62[4] - (0xff < sVar17);
              puVar2[0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar62[6] - (0xff < sVar18);
              puVar2[0xc] = (0 < sVar19) * (sVar19 < 0x100) * auVar62[8] - (0xff < sVar19);
              puVar2[0xd] = (0 < sVar20) * (sVar20 < 0x100) * auVar62[10] - (0xff < sVar20);
              puVar2[0xe] = (0 < sVar21) * (sVar21 < 0x100) * auVar62[0xc] - (0xff < sVar21);
              puVar2[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar62[0xe] - (0xff < sVar22);
              uVar33 = uVar33 + 4;
              uVar35 = uVar35 - 1;
            } while (uVar35 != 0);
          }
          if (uVar33 < uVar34) {
            lVar36 = sVar8 * lVar30;
            do {
              auVar58._0_4_ = auVar57._0_4_ + *(int32_t *)((long)&pCVar9[uVar33].cover + lVar36);
              auVar58._4_4_ = auVar57._4_4_;
              auVar58._8_4_ = auVar57._8_4_;
              auVar58._12_4_ = auVar57._12_4_;
              *(undefined8 *)((long)&pCVar9[uVar33].cover + lVar36) = 0;
              uVar32 = *(int32_t *)((long)&pCVar9[uVar33].area + lVar36) >> 9;
              auVar76._0_4_ = auVar58._0_4_ - uVar32;
              auVar76._4_4_ = auVar58._4_4_;
              auVar76._8_4_ = auVar58._8_4_;
              auVar76._12_4_ = auVar58._12_4_;
              auVar62 = pabsd(ZEXT416(uVar32),auVar76);
              auVar62 = packssdw(auVar62,auVar62);
              auVar62 = pshuflw(auVar62,auVar62,0);
              sVar59 = auVar62._0_2_;
              auVar68._0_2_ =
                   (ushort)(sVar38 < sVar59) * sVar38 | (ushort)(sVar38 >= sVar59) * sVar59;
              sVar59 = auVar62._2_2_;
              auVar68._2_2_ =
                   (ushort)(sVar40 < sVar59) * sVar40 | (ushort)(sVar40 >= sVar59) * sVar59;
              sVar59 = auVar62._4_2_;
              auVar68._4_2_ =
                   (ushort)(sVar41 < sVar59) * sVar41 | (ushort)(sVar41 >= sVar59) * sVar59;
              sVar59 = auVar62._6_2_;
              auVar68._6_2_ =
                   (ushort)(sVar42 < sVar59) * sVar42 | (ushort)(sVar42 >= sVar59) * sVar59;
              sVar59 = auVar62._8_2_;
              auVar68._8_2_ =
                   (ushort)(sVar43 < sVar59) * sVar43 | (ushort)(sVar43 >= sVar59) * sVar59;
              sVar59 = auVar62._10_2_;
              auVar68._10_2_ =
                   (ushort)(sVar44 < sVar59) * sVar44 | (ushort)(sVar44 >= sVar59) * sVar59;
              sVar59 = auVar62._12_2_;
              sVar70 = auVar62._14_2_;
              auVar68._12_2_ =
                   (ushort)(sVar46 < sVar59) * sVar46 | (ushort)(sVar46 >= sVar59) * sVar59;
              auVar68._14_2_ =
                   (ushort)(sVar48 < sVar70) * sVar48 | (ushort)(sVar48 >= sVar70) * sVar70;
              auVar74 = pmovzxbw(ZEXT416(*(uint *)(puVar29 + uVar33 * 4)),
                                 ZEXT416(*(uint *)(puVar29 + uVar33 * 4)));
              auVar62 = auVar68 ^ auVar51;
              auVar69._0_2_ = auVar62._0_2_ * auVar74._0_2_ + auVar68._0_2_ * sVar37 + auVar55._0_2_
              ;
              auVar69._2_2_ = auVar62._2_2_ * auVar74._2_2_ + auVar68._2_2_ * sVar50 + auVar55._2_2_
              ;
              auVar69._4_2_ = auVar62._4_2_ * auVar74._4_2_ + auVar68._4_2_ * sVar54 + auVar55._4_2_
              ;
              auVar69._6_2_ = auVar62._6_2_ * auVar74._6_2_ + auVar68._6_2_ * sVar77 + auVar55._6_2_
              ;
              auVar69._8_2_ = auVar62._8_2_ * auVar74._8_2_ + auVar68._8_2_ * sVar83 + auVar55._8_2_
              ;
              auVar69._10_2_ =
                   auVar62._10_2_ * auVar74._10_2_ + auVar68._10_2_ * sVar84 + auVar55._10_2_;
              auVar69._12_2_ =
                   auVar62._12_2_ * auVar74._12_2_ + auVar68._12_2_ * sVar45 + auVar55._12_2_;
              auVar69._14_2_ =
                   auVar62._14_2_ * auVar74._14_2_ + auVar68._14_2_ * sVar47 + auVar55._14_2_;
              auVar62 = pmulhuw(auVar69,auVar26);
              sVar59 = auVar62._0_2_;
              sVar70 = auVar62._2_2_;
              sVar72 = auVar62._4_2_;
              sVar10 = auVar62._6_2_;
              *(uint *)(puVar29 + uVar33 * 4) =
                   CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar62[6] - (0xff < sVar10),
                            CONCAT12((0 < sVar72) * (sVar72 < 0x100) * auVar62[4] - (0xff < sVar72),
                                     CONCAT11((0 < sVar70) * (sVar70 < 0x100) * auVar62[2] -
                                              (0xff < sVar70),
                                              (0 < sVar59) * (sVar59 < 0x100) * auVar62[0] -
                                              (0xff < sVar59))));
              uVar33 = uVar33 + 1;
              auVar57 = auVar58;
            } while (uVar34 != uVar33);
          }
        }
        uVar27 = uVar27 + 1;
        puVar29 = puVar29 + lVar6;
        lVar30 = lVar30 + 8;
      } while (uVar27 <= (ulong)(long)(int)uVar4);
    }
    (self->_yBounds).start = 0x7fffffff;
    (self->_yBounds).end = 0;
    return;
  }
  RasterizerA2::_renderImpl<CompositorScalar,true>(self,argb32);
  return;
}

Assistant:

inline bool hasOption(uint32_t option) const noexcept { return (_options & option) != 0; }